

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack2_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined8 uVar9;
  
  auVar6 = vpbroadcastd_avx512f(ZEXT416(*in));
  auVar4 = vpmovsxbd_avx2(ZEXT816(0x100e0c0a08060402));
  auVar5 = vpsrlvd_avx2(auVar6._0_32_,auVar4);
  auVar1 = vpsrlvd_avx2(auVar6._0_16_,_DAT_0019fce0);
  auVar2 = vpsrlvd_avx2(auVar6._0_16_,_DAT_001a4360);
  auVar7 = vpmovsxbd_avx512f(_DAT_00196470);
  auVar7 = vpermi2d_avx512f(auVar7,ZEXT3264(auVar5),auVar6);
  auVar8 = vpmovsxbd_avx512f(_DAT_00196480);
  auVar7 = vpermi2d_avx512f(auVar8,auVar7,ZEXT1664(auVar1));
  auVar8 = vpmovsxbd_avx512f(_DAT_00196450);
  auVar7 = vpermi2d_avx512f(auVar8,auVar7,ZEXT1664(auVar2));
  auVar8 = vpbroadcastd_avx512f(ZEXT416(3));
  auVar7 = vpandd_avx512f(auVar7,auVar8);
  auVar6 = vpsrld_avx512f(auVar6,0x1e);
  auVar6._0_60_ = auVar7._0_60_;
  auVar6 = vmovdqu64_avx512f(auVar6);
  *(undefined1 (*) [64])out = auVar6;
  auVar3 = vpbroadcastd_avx512vl();
  auVar1 = vpsrlvd_avx2(auVar3,auVar4._0_16_);
  auVar2 = vpsrlvd_avx2(auVar3,_DAT_001a4300);
  auVar4 = valignd_avx512vl(ZEXT1632(auVar1),ZEXT1632(auVar1),7);
  auVar4 = vpblendd_avx2(auVar4,ZEXT1632(auVar3),1);
  auVar5 = vpbroadcastd_avx512vl();
  auVar4 = vpblendd_avx2(auVar4,auVar5,0x20);
  uVar9 = auVar2._0_8_;
  auVar5._8_8_ = uVar9;
  auVar5._0_8_ = uVar9;
  auVar5._16_8_ = uVar9;
  auVar5._24_8_ = uVar9;
  auVar4 = vpblendd_avx2(auVar4,auVar5,0xc0);
  auVar4 = vpand_avx2(auVar4,auVar8._0_32_);
  *(undefined1 (*) [32])(out + 0x10) = auVar4;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack2_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 2);
  out++;
  *out = ((*in) >> 2) % (1U << 2);
  out++;
  *out = ((*in) >> 4) % (1U << 2);
  out++;
  *out = ((*in) >> 6) % (1U << 2);
  out++;
  *out = ((*in) >> 8) % (1U << 2);
  out++;
  *out = ((*in) >> 10) % (1U << 2);
  out++;
  *out = ((*in) >> 12) % (1U << 2);
  out++;
  *out = ((*in) >> 14) % (1U << 2);
  out++;
  *out = ((*in) >> 16) % (1U << 2);
  out++;
  *out = ((*in) >> 18) % (1U << 2);
  out++;
  *out = ((*in) >> 20) % (1U << 2);
  out++;
  *out = ((*in) >> 22) % (1U << 2);
  out++;
  *out = ((*in) >> 24) % (1U << 2);
  out++;
  *out = ((*in) >> 26) % (1U << 2);
  out++;
  *out = ((*in) >> 28) % (1U << 2);
  out++;
  *out = ((*in) >> 30);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 2);
  out++;
  *out = ((*in) >> 2) % (1U << 2);
  out++;
  *out = ((*in) >> 4) % (1U << 2);
  out++;
  *out = ((*in) >> 6) % (1U << 2);
  out++;
  *out = ((*in) >> 8) % (1U << 2);
  out++;
  *out = ((*in) >> 10) % (1U << 2);
  out++;
  *out = ((*in) >> 12) % (1U << 2);
  out++;
  *out = ((*in) >> 14) % (1U << 2);
  out++;

  return in + 1;
}